

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_offsetof(lua_State *L)

{
  GCtab *pGVar1;
  CType *pCVar2;
  CType *fct;
  CType *pCStack_78;
  CTSize ofs;
  CType *ct;
  GCstr *name;
  CTState *pCStack_60;
  CTypeID id;
  CTState *cts;
  lua_State *L_local;
  CTState *local_48;
  CTState *cts_1;
  
  pCStack_60 = *(CTState **)((L->glref).ptr64 + 0x180);
  pCStack_60->L = L;
  cts = (CTState *)L;
  local_48 = pCStack_60;
  cts_1 = (CTState *)L;
  name._4_4_ = ffi_checkctype(L,pCStack_60,(TValue *)0x0);
  ct = (CType *)lj_lib_checkstr((lua_State *)cts,2);
  pCStack_78 = lj_ctype_rawref(pCStack_60,name._4_4_);
  if (((pCStack_78->info >> 0x1c == 1) && (pCStack_78->size != 0xffffffff)) &&
     (pCVar2 = lj_ctype_getfieldq(pCStack_60,pCStack_78,(GCstr *)ct,(CTSize *)((long)&fct + 4),
                                  (CTInfo *)0x0), pCVar2 != (CType *)0x0)) {
    cts->miscmap[-1].freetop.ptr64 = (uint64_t)(double)fct._4_4_;
    if (pCVar2->info >> 0x1c == 9) {
      return 1;
    }
    if (pCVar2->info >> 0x1c == 10) {
      pGVar1 = cts->miscmap;
      cts->miscmap = (GCtab *)&pGVar1->marked;
      (pGVar1->nextgc).gcptr64 = (uint64_t)(double)(pCVar2->info & 0x7f);
      pGVar1 = cts->miscmap;
      cts->miscmap = (GCtab *)&pGVar1->marked;
      (pGVar1->nextgc).gcptr64 = (uint64_t)(double)(pCVar2->info >> 8 & 0x7f);
      return 3;
    }
  }
  return 0;
}

Assistant:

LJLIB_CF(ffi_offsetof)	LJLIB_REC(ffi_xof FF_ffi_offsetof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  GCstr *name = lj_lib_checkstr(L, 2);
  CType *ct = lj_ctype_rawref(cts, id);
  CTSize ofs;
  if (ctype_isstruct(ct->info) && ct->size != CTSIZE_INVALID) {
    CType *fct = lj_ctype_getfield(cts, ct, name, &ofs);
    if (fct) {
      setintV(L->top-1, ofs);
      if (ctype_isfield(fct->info)) {
	return 1;
      } else if (ctype_isbitfield(fct->info)) {
	setintV(L->top++, ctype_bitpos(fct->info));
	setintV(L->top++, ctype_bitbsz(fct->info));
	return 3;
      }
    }
  }
  return 0;
}